

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nosimd.h
# Opt level: O0

void nosimd::arithmetic::divC<long>(long *pSrc,long val,long *pDst,int len)

{
  int local_2c;
  int local_28;
  int i_1;
  int i;
  int len_local;
  long *pDst_local;
  long val_local;
  long *pSrc_local;
  
  if (pSrc == pDst) {
    for (local_28 = 0; local_28 < len; local_28 = local_28 + 1) {
      pDst[local_28] = pDst[local_28] / val;
    }
  }
  else {
    for (local_2c = 0; local_2c < len; local_2c = local_2c + 1) {
      pDst[local_2c] = pSrc[local_2c] / val;
    }
  }
  return;
}

Assistant:

inline void divC(const _T * pSrc, _T val, _T * pDst, int len)
        {
            if (pSrc == pDst)
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] /= val;
            }
            else
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] = pSrc[i] / val;
            }
        }